

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::FindRenderedTextEnd(char *text,char *text_end)

{
  bool bVar1;
  char *text_display_end;
  char *text_end_local;
  char *text_local;
  
  text_display_end = text;
  text_end_local = text_end;
  if (text_end == (char *)0x0) {
    text_end_local = (char *)0xffffffffffffffff;
  }
  while( true ) {
    bVar1 = false;
    if (((text_display_end < text_end_local) && (bVar1 = false, *text_display_end != '\0')) &&
       (bVar1 = true, *text_display_end == '#')) {
      bVar1 = text_display_end[1] != '#';
    }
    if (!bVar1) break;
    text_display_end = text_display_end + 1;
  }
  return text_display_end;
}

Assistant:

const char* ImGui::FindRenderedTextEnd(const char* text, const char* text_end)
{
    const char* text_display_end = text;
    if (!text_end)
        text_end = (const char*)-1;

    while (text_display_end < text_end && *text_display_end != '\0' && (text_display_end[0] != '#' || text_display_end[1] != '#'))
        text_display_end++;
    return text_display_end;
}